

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actions.hpp
# Opt level: O2

event_process_result
afsm::actions::detail::
inner_dispatch_table<std::tuple<afsm::state<vending::vending_def::on::maintenance::loading,_afsm::inner_state_machine<vending::vending_def::on::maintenance,_afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>,_afsm::state<vending::vending_def::on::maintenance::idle,_afsm::inner_state_machine<vending::vending_def::on::maintenance,_afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>_>_>
::process_event<vending::events::load_done>
          (states_tuple *states,size_t current_state,load_done *event)

{
  event_process_result eVar1;
  invocation_table<vending::events::load_done> *piVar2;
  logic_error *this;
  indexes_tuple<0UL,_1UL> local_59;
  invocation_table<vending::events::load_done> inv_table;
  
  if (current_state < 2) {
    piVar2 = inner_dispatch_table<std::tuple<afsm::state<vending::vending_def::on::maintenance::loading,afsm::inner_state_machine<vending::vending_def::on::maintenance,afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>>,afsm::state<vending::vending_def::on::maintenance::idle,afsm::inner_state_machine<vending::vending_def::on::maintenance,afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>>>>
             ::state_table<vending::events::load_done,0ul,1ul>(&local_59);
    std::
    array<std::function<afsm::actions::event_process_result_(std::tuple<afsm::state<vending::vending_def::on::maintenance::loading,_afsm::inner_state_machine<vending::vending_def::on::maintenance,_afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>,_afsm::state<vending::vending_def::on::maintenance::idle,_afsm::inner_state_machine<vending::vending_def::on::maintenance,_afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>_>_&,_vending::events::load_done_&&)>,_2UL>
    ::array(&inv_table,piVar2);
    eVar1 = std::
            function<afsm::actions::event_process_result_(std::tuple<afsm::state<vending::vending_def::on::maintenance::loading,_afsm::inner_state_machine<vending::vending_def::on::maintenance,_afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>,_afsm::state<vending::vending_def::on::maintenance::idle,_afsm::inner_state_machine<vending::vending_def::on::maintenance,_afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>_>_&,_vending::events::load_done_&&)>
            ::operator()(inv_table._M_elems + current_state,states,event);
    std::
    array<std::function<afsm::actions::event_process_result_(std::tuple<afsm::state<vending::vending_def::on::maintenance::loading,_afsm::inner_state_machine<vending::vending_def::on::maintenance,_afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>,_afsm::state<vending::vending_def::on::maintenance::idle,_afsm::inner_state_machine<vending::vending_def::on::maintenance,_afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>_>_&,_vending::events::load_done_&&)>,_2UL>
    ::~array(&inv_table);
    return eVar1;
  }
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this,"Invalid current state index");
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

static event_process_result
    process_event(states_tuple& states, ::std::size_t current_state, Event&& event)
    {
        //using event_type = typename ::std::decay<Event>::type;
        if (current_state >= size)
            throw ::std::logic_error{ "Invalid current state index" };
        auto inv_table = state_table< Event >(indexes_tuple{});
        return inv_table[current_state](states, ::std::forward<Event>(event));
    }